

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFmap.c
# Opt level: O0

void setup_hash(NF_link_map *l)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  Elf32_Word bitmask_nwords;
  Elf32_Word symbias;
  Elf32_Word *hash32;
  uint32_t *hash;
  NF_link_map *l_local;
  
  puVar3 = (uint32_t *)(l->l_info[0x23]->d_un).d_val;
  l->l_nbuckets = *puVar3;
  uVar1 = puVar3[1];
  uVar2 = puVar3[2];
  l->l_gnu_bitmask_idxbits = uVar2 - 1;
  l->l_gnu_shift = puVar3[3];
  l->l_gnu_bitmask = (Elf64_Addr *)(puVar3 + 4);
  puVar3 = (uint32_t *)((long)(puVar3 + 4) + (ulong)(uVar2 << 1) * 4);
  l->l_gnu_buckets = puVar3;
  l->l_gnu_chain_zero = puVar3 + ((ulong)l->l_nbuckets - (ulong)uVar1);
  return;
}

Assistant:

static void setup_hash(struct NF_link_map *l)
{
    /* it would be impossible if we don't use hash table when searching
        So I set up the hash table here 
        Currently only support gnu hash */
    uint32_t *hash;

    /* borrowed from dl-lookup.c:_dl_setup_hash */
    Elf32_Word *hash32 = (Elf32_Word *)l->l_info[35]->d_un.d_ptr;
    l->l_nbuckets = *hash32++;
    Elf32_Word symbias = *hash32++;
    Elf32_Word bitmask_nwords = *hash32++;

    l->l_gnu_bitmask_idxbits = bitmask_nwords - 1;
    l->l_gnu_shift = *hash32++;

    l->l_gnu_bitmask = (Elf64_Addr *)hash32;
    hash32 += 64 / 32 * bitmask_nwords;

    l->l_gnu_buckets = hash32;
    hash32 += l->l_nbuckets;
    l->l_gnu_chain_zero = hash32 - symbias;
}